

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

bool __thiscall QTreeView::viewportEvent(QTreeView *this,QEvent *event)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  QWidget *this_01;
  QHoverEvent *he;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    iVar1 = this_00->hoverBranch;
    dVar5 = (double)QEventPoint::position();
    dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
    dVar7 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar7 = dVar5;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_48._0_4_ = (int)dVar7;
    in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
    dVar7 = 2147483647.0;
    if (in_XMM1_Qa <= 2147483647.0) {
      dVar7 = in_XMM1_Qa;
    }
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_48._4_4_ = (int)dVar7;
    iVar4 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_48);
    this_00->hoverBranch = iVar4;
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    dVar6 = (double)QEventPoint::position();
    dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
    dVar5 = 2147483647.0;
    if (dVar6 <= 2147483647.0) {
      dVar5 = dVar6;
    }
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    dVar6 = 2147483647.0;
    if (dVar7 <= 2147483647.0) {
      dVar6 = dVar7;
    }
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_58.y1.m_i = (int)dVar6;
    local_58.x1.m_i = (int)dVar5;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))((QModelIndex *)&local_48,this);
    cVar2 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).hover,(QModelIndex *)&local_48)
    ;
    if ((cVar2 == '\0') || (this_00->hoverBranch != iVar1)) {
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      local_58 = QTreeViewPrivate::visualRect(this_00,(QModelIndex *)&local_48,FullRow);
      QWidget::update(this_01,&local_58);
    }
  }
  bVar3 = QAbstractItemView::viewportEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::viewportEvent(QEvent *event)
{
    Q_D(QTreeView);
    switch (event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove: {
        QHoverEvent *he = static_cast<QHoverEvent*>(event);
        const int oldBranch = d->hoverBranch;
        d->hoverBranch = d->itemDecorationAt(he->position().toPoint());
        QModelIndex newIndex = indexAt(he->position().toPoint());
        if (d->hover != newIndex || d->hoverBranch != oldBranch) {
            // Update the whole hovered over row. No need to update the old hovered
            // row, that is taken care in superclass hover handling.
            viewport()->update(d->visualRect(newIndex, QTreeViewPrivate::FullRow));
        }
        break; }
    default:
        break;
    }
    return QAbstractItemView::viewportEvent(event);
}